

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

void ngram_fwdtree_start(ngram_search_t *ngs)

{
  int iVar1;
  last_ltrans_t *plVar2;
  chan_t *h;
  long lVar3;
  long lVar4;
  
  iVar1 = (ngs->base).n_words;
  lVar4 = (long)iVar1;
  (ngs->st).n_phone_eval = 0;
  (ngs->st).n_root_chan_eval = 0;
  (ngs->st).n_nonroot_chan_eval = 0;
  (ngs->st).n_last_chan_eval = 0;
  (ngs->st).n_word_lastchan_eval = 0;
  (ngs->st).n_lastphn_cand_utt = 0;
  (ngs->st).n_fwdflat_chan = 0;
  (ngs->st).n_fwdflat_words = 0;
  (ngs->st).n_fwdflat_word_transition = 0;
  (ngs->st).n_senone_active_utt = 0;
  ptmr_reset(&ngs->fwdtree_perf);
  ptmr_start(&ngs->fwdtree_perf);
  ngs->bpidx = 0;
  ngs->bss_head = 0;
  if (0 < lVar4) {
    memset(ngs->word_lat_idx,0xff,lVar4 * 4);
  }
  ngs->n_active_chan[0] = 0;
  ngs->n_active_chan[1] = 0;
  ngs->n_active_word[0] = 0;
  ngs->n_active_word[1] = 0;
  ngs->best_score = 0;
  ngs->renormalized = 0;
  if (0 < iVar1) {
    plVar2 = ngs->last_ltrans;
    lVar3 = 0;
    do {
      *(undefined4 *)((long)&plVar2->sf + lVar3) = 0xffffffff;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 * 0xc != lVar3);
  }
  ngs->n_frame = 0;
  ckd_free((ngs->base).hyp_str);
  (ngs->base).hyp_str = (char *)0x0;
  if (0 < ngs->n_1ph_words) {
    lVar4 = 0;
    do {
      hmm_clear(&ngs->word_chan[ngs->single_phone_wid[lVar4]]->hmm);
      lVar4 = lVar4 + 1;
    } while (lVar4 < ngs->n_1ph_words);
  }
  h = ngs->word_chan[((ngs->base).dict)->startwid];
  hmm_clear(&h->hmm);
  hmm_enter(&h->hmm,0,-1,0);
  return;
}

Assistant:

void
ngram_fwdtree_start(ngram_search_t *ngs)
{
    ps_search_t *base = (ps_search_t *)ngs;
    int32 i, w, n_words;
    root_chan_t *rhmm;

    n_words = ps_search_n_words(ngs);

    /* Reset utterance statistics. */
    memset(&ngs->st, 0, sizeof(ngs->st));
    ptmr_reset(&ngs->fwdtree_perf);
    ptmr_start(&ngs->fwdtree_perf);

    /* Reset backpointer table. */
    ngs->bpidx = 0;
    ngs->bss_head = 0;

    /* Reset word lattice. */
    for (i = 0; i < n_words; ++i)
        ngs->word_lat_idx[i] = NO_BP;

    /* Reset active HMM and word lists. */
    ngs->n_active_chan[0] = ngs->n_active_chan[1] = 0;
    ngs->n_active_word[0] = ngs->n_active_word[1] = 0;

    /* Reset scores. */
    ngs->best_score = 0;
    ngs->renormalized = 0;

    /* Reset other stuff. */
    for (i = 0; i < n_words; i++)
        ngs->last_ltrans[i].sf = -1;
    ngs->n_frame = 0;

    /* Clear the hypothesis string. */
    ckd_free(base->hyp_str);
    base->hyp_str = NULL;

    /* Reset the permanently allocated single-phone words, since they
     * may have junk left over in them from FWDFLAT. */
    for (i = 0; i < ngs->n_1ph_words; i++) {
        w = ngs->single_phone_wid[i];
        rhmm = (root_chan_t *) ngs->word_chan[w];
        hmm_clear(&rhmm->hmm);
    }

    /* Start search with <s>; word_chan[<s>] is permanently allocated */
    rhmm = (root_chan_t *) ngs->word_chan[dict_startwid(ps_search_dict(ngs))];
    hmm_clear(&rhmm->hmm);
    hmm_enter(&rhmm->hmm, 0, NO_BP, 0);
}